

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# events.c
# Opt level: O0

int main(int argc,char **argv)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  void *__ptr;
  char *pcVar4;
  GLFWwindow *pGVar5;
  char local_c8 [8];
  char title [128];
  GLFWvidmode *mode;
  uint local_38;
  int count;
  int height;
  int width;
  int i;
  int ch;
  GLFWmonitor *monitor;
  Slot *slots;
  char **argv_local;
  int argc_local;
  
  _i = (GLFWmonitor *)0x0;
  mode._4_4_ = 1;
  setlocale(6,"");
  glfwSetErrorCallback(error_callback);
  iVar2 = glfwInit();
  if (iVar2 == 0) {
    exit(1);
  }
  printf("Library initialized\n");
  glfwSetMonitorCallback(monitor_callback);
  glfwSetJoystickCallback(joystick_callback);
  while( true ) {
    while( true ) {
      iVar2 = getopt(argc,argv,"hfn:");
      if (iVar2 == -1) {
        if (_i == (GLFWmonitor *)0x0) {
          count = 0x280;
          local_38 = 0x1e0;
        }
        else {
          title._120_8_ = glfwGetVideoMode(_i);
          glfwWindowHint(0x2100f,((GLFWvidmode *)title._120_8_)->refreshRate);
          glfwWindowHint(0x21001,*(int *)(title._120_8_ + 8));
          glfwWindowHint(0x21002,*(int *)(title._120_8_ + 0xc));
          glfwWindowHint(0x21003,*(int *)(title._120_8_ + 0x10));
          count = *(int *)title._120_8_;
          local_38 = *(uint *)(title._120_8_ + 4);
        }
        __ptr = calloc((long)mode._4_4_,0x10);
        height = 0;
        while( true ) {
          if (mode._4_4_ <= height) {
            printf("Main loop starting\n");
            while( true ) {
              height = 0;
              while ((height < mode._4_4_ &&
                     (iVar2 = glfwWindowShouldClose
                                        (*(GLFWwindow **)((long)__ptr + (long)height * 0x10)),
                     iVar2 == 0))) {
                height = height + 1;
              }
              if (height < mode._4_4_) break;
              glfwWaitEvents();
              fflush(_stdout);
            }
            free(__ptr);
            glfwTerminate();
            exit(0);
          }
          *(undefined4 *)((long)__ptr + (long)height * 0x10 + 0xc) = 1;
          *(int *)((long)__ptr + (long)height * 0x10 + 8) = height + 1;
          snprintf(local_c8,0x80,"Event Linter (Window %i)",
                   (ulong)*(uint *)((long)__ptr + (long)height * 0x10 + 8));
          if (_i == (GLFWmonitor *)0x0) {
            printf("Creating windowed mode window %i (%ix%i)\n",
                   (ulong)*(uint *)((long)__ptr + (long)height * 0x10 + 8),(ulong)(uint)count,
                   (ulong)local_38);
          }
          else {
            uVar1 = *(uint *)((long)__ptr + (long)height * 0x10 + 8);
            pcVar4 = glfwGetMonitorName(_i);
            printf("Creating full screen window %i (%ix%i on %s)\n",(ulong)uVar1,(ulong)(uint)count,
                   (ulong)local_38,pcVar4);
          }
          pGVar5 = glfwCreateWindow(count,local_38,local_c8,_i,(GLFWwindow *)0x0);
          *(GLFWwindow **)((long)__ptr + (long)height * 0x10) = pGVar5;
          if (*(long *)((long)__ptr + (long)height * 0x10) == 0) break;
          glfwSetWindowUserPointer
                    (*(GLFWwindow **)((long)__ptr + (long)height * 0x10),
                     (void *)((long)__ptr + (long)height * 0x10));
          glfwSetWindowPosCallback
                    (*(GLFWwindow **)((long)__ptr + (long)height * 0x10),window_pos_callback);
          glfwSetWindowSizeCallback
                    (*(GLFWwindow **)((long)__ptr + (long)height * 0x10),window_size_callback);
          glfwSetFramebufferSizeCallback
                    (*(GLFWwindow **)((long)__ptr + (long)height * 0x10),framebuffer_size_callback);
          glfwSetWindowContentScaleCallback
                    (*(GLFWwindow **)((long)__ptr + (long)height * 0x10),
                     window_content_scale_callback);
          glfwSetWindowCloseCallback
                    (*(GLFWwindow **)((long)__ptr + (long)height * 0x10),window_close_callback);
          glfwSetWindowRefreshCallback
                    (*(GLFWwindow **)((long)__ptr + (long)height * 0x10),window_refresh_callback);
          glfwSetWindowFocusCallback
                    (*(GLFWwindow **)((long)__ptr + (long)height * 0x10),window_focus_callback);
          glfwSetWindowIconifyCallback
                    (*(GLFWwindow **)((long)__ptr + (long)height * 0x10),window_iconify_callback);
          glfwSetWindowMaximizeCallback
                    (*(GLFWwindow **)((long)__ptr + (long)height * 0x10),window_maximize_callback);
          glfwSetMouseButtonCallback
                    (*(GLFWwindow **)((long)__ptr + (long)height * 0x10),mouse_button_callback);
          glfwSetCursorPosCallback
                    (*(GLFWwindow **)((long)__ptr + (long)height * 0x10),cursor_position_callback);
          glfwSetCursorEnterCallback
                    (*(GLFWwindow **)((long)__ptr + (long)height * 0x10),cursor_enter_callback);
          glfwSetScrollCallback(*(GLFWwindow **)((long)__ptr + (long)height * 0x10),scroll_callback)
          ;
          glfwSetKeyCallback(*(GLFWwindow **)((long)__ptr + (long)height * 0x10),key_callback);
          glfwSetCharCallback(*(GLFWwindow **)((long)__ptr + (long)height * 0x10),char_callback);
          glfwSetDropCallback(*(GLFWwindow **)((long)__ptr + (long)height * 0x10),drop_callback);
          glfwMakeContextCurrent(*(GLFWwindow **)((long)__ptr + (long)height * 0x10));
          gladLoadGLLoader(glfwGetProcAddress);
          glfwSwapInterval(1);
          height = height + 1;
        }
        free(__ptr);
        glfwTerminate();
        exit(1);
      }
      if (iVar2 != 0x66) break;
      _i = glfwGetPrimaryMonitor();
    }
    if (iVar2 == 0x68) break;
    if (iVar2 != 0x6e) {
      usage();
      exit(1);
    }
    uVar3 = strtoul(optarg,(char **)0x0,10);
    mode._4_4_ = (int)uVar3;
  }
  usage();
  exit(0);
}

Assistant:

int main(int argc, char** argv)
{
    Slot* slots;
    GLFWmonitor* monitor = NULL;
    int ch, i, width, height, count = 1;

    setlocale(LC_ALL, "");

    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    printf("Library initialized\n");

    glfwSetMonitorCallback(monitor_callback);
    glfwSetJoystickCallback(joystick_callback);

    while ((ch = getopt(argc, argv, "hfn:")) != -1)
    {
        switch (ch)
        {
            case 'h':
                usage();
                exit(EXIT_SUCCESS);

            case 'f':
                monitor = glfwGetPrimaryMonitor();
                break;

            case 'n':
                count = (int) strtoul(optarg, NULL, 10);
                break;

            default:
                usage();
                exit(EXIT_FAILURE);
        }
    }

    if (monitor)
    {
        const GLFWvidmode* mode = glfwGetVideoMode(monitor);

        glfwWindowHint(GLFW_REFRESH_RATE, mode->refreshRate);
        glfwWindowHint(GLFW_RED_BITS, mode->redBits);
        glfwWindowHint(GLFW_GREEN_BITS, mode->greenBits);
        glfwWindowHint(GLFW_BLUE_BITS, mode->blueBits);

        width = mode->width;
        height = mode->height;
    }
    else
    {
        width  = 640;
        height = 480;
    }

    slots = calloc(count, sizeof(Slot));

    for (i = 0;  i < count;  i++)
    {
        char title[128];

        slots[i].closeable = GLFW_TRUE;
        slots[i].number = i + 1;

        snprintf(title, sizeof(title), "Event Linter (Window %i)", slots[i].number);

        if (monitor)
        {
            printf("Creating full screen window %i (%ix%i on %s)\n",
                   slots[i].number,
                   width, height,
                   glfwGetMonitorName(monitor));
        }
        else
        {
            printf("Creating windowed mode window %i (%ix%i)\n",
                   slots[i].number,
                   width, height);
        }

        slots[i].window = glfwCreateWindow(width, height, title, monitor, NULL);
        if (!slots[i].window)
        {
            free(slots);
            glfwTerminate();
            exit(EXIT_FAILURE);
        }

        glfwSetWindowUserPointer(slots[i].window, slots + i);

        glfwSetWindowPosCallback(slots[i].window, window_pos_callback);
        glfwSetWindowSizeCallback(slots[i].window, window_size_callback);
        glfwSetFramebufferSizeCallback(slots[i].window, framebuffer_size_callback);
        glfwSetWindowContentScaleCallback(slots[i].window, window_content_scale_callback);
        glfwSetWindowCloseCallback(slots[i].window, window_close_callback);
        glfwSetWindowRefreshCallback(slots[i].window, window_refresh_callback);
        glfwSetWindowFocusCallback(slots[i].window, window_focus_callback);
        glfwSetWindowIconifyCallback(slots[i].window, window_iconify_callback);
        glfwSetWindowMaximizeCallback(slots[i].window, window_maximize_callback);
        glfwSetMouseButtonCallback(slots[i].window, mouse_button_callback);
        glfwSetCursorPosCallback(slots[i].window, cursor_position_callback);
        glfwSetCursorEnterCallback(slots[i].window, cursor_enter_callback);
        glfwSetScrollCallback(slots[i].window, scroll_callback);
        glfwSetKeyCallback(slots[i].window, key_callback);
        glfwSetCharCallback(slots[i].window, char_callback);
        glfwSetDropCallback(slots[i].window, drop_callback);

        glfwMakeContextCurrent(slots[i].window);
        gladLoadGLLoader((GLADloadproc) glfwGetProcAddress);
        glfwSwapInterval(1);
    }

    printf("Main loop starting\n");

    for (;;)
    {
        for (i = 0;  i < count;  i++)
        {
            if (glfwWindowShouldClose(slots[i].window))
                break;
        }

        if (i < count)
            break;

        glfwWaitEvents();

        // Workaround for an issue with msvcrt and mintty
        fflush(stdout);
    }

    free(slots);
    glfwTerminate();
    exit(EXIT_SUCCESS);
}